

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Performance::DrawCallBatchingTests::init(DrawCallBatchingTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  Context *pCVar3;
  TestCaseGroup *pTVar4;
  int iVar5;
  TestCaseGroup *pTVar6;
  char *pcVar7;
  TestCaseGroup *this_00;
  DrawCallBatchingTest *this_01;
  char *pcVar8;
  TestSpec *spec_00;
  bool bVar9;
  undefined1 auVar10 [16];
  string local_290;
  string local_270;
  undefined1 local_24c [8];
  TestSpec spec;
  bool useStaticBuffer;
  int staticBufferNdx;
  bool useDynamicBuffer;
  int dynamicBufferNdx;
  int triangleCount;
  int triangleCountNdx;
  int dynamicAttributeCount;
  int staticAttributeCount;
  TestCaseGroup *attributeCountGroup;
  int attributeCountNdx;
  TestCaseGroup *attributeCount8Group;
  TestCaseGroup *attributeCount1Group;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  TestCaseGroup *local_148;
  TestCaseGroup *callCountGroup;
  int local_138;
  int drawCallCount;
  int drawCallCountNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  TestCaseGroup *local_78;
  TestCaseGroup *drawTypeGroup;
  bool dynamicIndices;
  int dynamicIndexNdx;
  bool useIndexBuffer;
  int indexBufferNdx;
  bool drawElements;
  undefined8 uStack_58;
  int drawType;
  int dynamicAttributeCounts [5];
  int staticAttributeCounts [5];
  int triangleCounts [2];
  int drawCallCounts [2];
  DrawCallBatchingTests *this_local;
  
  triangleCounts[0] = 10;
  triangleCounts[1] = 100;
  stack0xffffffffffffffe0 = 0xa00000002;
  staticAttributeCounts[0] = 4;
  staticAttributeCounts[1] = 8;
  staticAttributeCounts[2] = 0;
  uStack_58 = 0x100000000;
  dynamicAttributeCounts[0] = 4;
  dynamicAttributeCounts[1] = 0;
  iVar5 = 8;
  dynamicAttributeCounts[2] = 8;
  indexBufferNdx = 0;
  while (indexBufferNdx < 2) {
    useIndexBuffer = indexBufferNdx == 1;
    for (dynamicIndexNdx = 0; dynamicIndexNdx < 2; dynamicIndexNdx = dynamicIndexNdx + 1) {
      dynamicIndices = dynamicIndexNdx == 1;
      if ((!dynamicIndices) || ((useIndexBuffer & 1U) != 0)) {
        for (drawTypeGroup._4_4_ = 0; drawTypeGroup._4_4_ < 2;
            drawTypeGroup._4_4_ = drawTypeGroup._4_4_ + 1) {
          drawTypeGroup._3_1_ = drawTypeGroup._4_4_ == 1;
          if (((!(bool)drawTypeGroup._3_1_) || ((useIndexBuffer & 1U) != 0)) &&
             ((!(bool)drawTypeGroup._3_1_ || ((dynamicIndices & 1U) != 0)))) {
            pTVar6 = (TestCaseGroup *)operator_new(0x78);
            drawCallCount._2_1_ = 1;
            pCVar3 = (this->super_TestCaseGroup).m_context;
            pcVar7 = "";
            if ((drawTypeGroup._3_1_ & 1) != 0) {
              pcVar7 = "dynamic_";
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar7,&local_d9)
            ;
            pcVar7 = "";
            if ((dynamicIndices & 1U) != 0) {
              pcVar7 = "buffer_";
            }
            std::operator+(&local_b8,&local_d8,pcVar7);
            pcVar7 = "draw_arrays";
            if ((useIndexBuffer & 1U) != 0) {
              pcVar7 = "draw_elements";
            }
            std::operator+(&local_98,&local_b8,pcVar7);
            pcVar7 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&drawCallCountNdx,"Test batched rendering with ",
                       (allocator<char> *)((long)&drawCallCount + 3));
            pcVar8 = "draw_arrays";
            if ((useIndexBuffer & 1U) != 0) {
              pcVar8 = "draw_elements";
            }
            std::operator+(&local_110,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &drawCallCountNdx,pcVar8);
            pcVar8 = (char *)std::__cxx11::string::c_str();
            TestCaseGroup::TestCaseGroup(pTVar6,pCVar3,pcVar7,pcVar8);
            drawCallCount._2_1_ = 0;
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&drawCallCountNdx);
            std::allocator<char>::~allocator((allocator<char> *)((long)&drawCallCount + 3));
            std::__cxx11::string::~string((string *)&local_98);
            std::__cxx11::string::~string((string *)&local_b8);
            std::__cxx11::string::~string((string *)&local_d8);
            std::allocator<char>::~allocator(&local_d9);
            local_78 = pTVar6;
            tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
            for (local_138 = 0; local_138 < 2; local_138 = local_138 + 1) {
              callCountGroup._4_4_ = triangleCounts[local_138];
              pTVar6 = (TestCaseGroup *)operator_new(0x78);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              de::toString<int>(&local_188,(int *)((long)&callCountGroup + 4));
              pcVar7 = "_draws";
              if (callCountGroup._4_4_ == 1) {
                pcVar7 = "_draw";
              }
              std::operator+(&local_168,&local_188,pcVar7);
              pcVar7 = (char *)std::__cxx11::string::c_str();
              de::toString<int>(&local_1e8,(int *)((long)&callCountGroup + 4));
              std::operator+(&local_1c8,"Test batched rendering performance with ",&local_1e8);
              std::operator+(&local_1a8,&local_1c8," draw calls.");
              pcVar8 = (char *)std::__cxx11::string::c_str();
              TestCaseGroup::TestCaseGroup(pTVar6,pCVar3,pcVar7,pcVar8);
              std::__cxx11::string::~string((string *)&local_1a8);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)&local_168);
              std::__cxx11::string::~string((string *)&local_188);
              local_148 = pTVar6;
              pTVar6 = (TestCaseGroup *)operator_new(0x78);
              TestCaseGroup::TestCaseGroup
                        (pTVar6,(this->super_TestCaseGroup).m_context,"1_attribute",
                         "Test draw call batching with 1 attribute.");
              this_00 = (TestCaseGroup *)operator_new(0x78);
              TestCaseGroup::TestCaseGroup
                        (this_00,(this->super_TestCaseGroup).m_context,"8_attributes",
                         "Test draw call batching with 8 attributes.");
              tcu::TestNode::addChild((TestNode *)local_148,(TestNode *)pTVar6);
              tcu::TestNode::addChild((TestNode *)local_148,(TestNode *)this_00);
              tcu::TestNode::addChild((TestNode *)local_78,(TestNode *)local_148);
              for (attributeCountGroup._4_4_ = 0; attributeCountGroup._4_4_ < 5;
                  attributeCountGroup._4_4_ = attributeCountGroup._4_4_ + 1) {
                _dynamicAttributeCount = (TestCaseGroup *)0x0;
                iVar5 = staticAttributeCounts[(long)attributeCountGroup._4_4_ + -2];
                iVar1 = *(int *)((long)&stack0xffffffffffffffa8 +
                                (long)attributeCountGroup._4_4_ * 4);
                pTVar4 = pTVar6;
                if ((iVar5 + iVar1 != 1) && (pTVar4 = _dynamicAttributeCount, iVar5 + iVar1 == 8)) {
                  pTVar4 = this_00;
                }
                _dynamicAttributeCount = pTVar4;
                for (dynamicBufferNdx = 0; dynamicBufferNdx < 2;
                    dynamicBufferNdx = dynamicBufferNdx + 1) {
                  iVar2 = staticAttributeCounts[(long)dynamicBufferNdx + 4];
                  for (staticBufferNdx = 0; staticBufferNdx < 2;
                      staticBufferNdx = staticBufferNdx + 1) {
                    bVar9 = staticBufferNdx != 0;
                    spec.useDrawElements = false;
                    spec.useIndexBuffer = false;
                    spec.dynamicIndices = false;
                    spec._27_1_ = 0;
                    for (; (int)spec._24_4_ < 2; spec._24_4_ = spec._24_4_ + 1) {
                      local_24c[0] = (_anonymous_namespace_)(spec._24_4_ != 0);
                      spec.dynamicAttributeCount = callCountGroup._4_4_;
                      spec.triangleCount._0_1_ = useIndexBuffer & 1;
                      spec.triangleCount._1_1_ = dynamicIndices & 1;
                      spec.triangleCount._2_1_ = drawTypeGroup._3_1_ & 1;
                      local_24c._4_4_ = iVar5;
                      spec.useStaticBuffer = bVar9;
                      spec.staticAttributeCount = iVar1;
                      spec._8_4_ = iVar2;
                      spec.drawCallCount._3_1_ = local_24c[0];
                      if (((!(bool)local_24c[0]) || (iVar5 != 0)) && ((!bVar9 || (iVar1 != 0)))) {
                        this_01 = (DrawCallBatchingTest *)operator_new(0x1d8);
                        pCVar3 = (this->super_TestCaseGroup).m_context;
                        (anonymous_namespace)::specToName_abi_cxx11_
                                  (&local_270,(_anonymous_namespace_ *)local_24c,spec_00);
                        auVar10 = std::__cxx11::string::c_str();
                        (anonymous_namespace)::specToDescrpition_abi_cxx11_
                                  (&local_290,(_anonymous_namespace_ *)local_24c,auVar10._8_8_);
                        pcVar7 = (char *)std::__cxx11::string::c_str();
                        anon_unknown_0::DrawCallBatchingTest::DrawCallBatchingTest
                                  (this_01,pCVar3,auVar10._0_8_,pcVar7,(TestSpec *)local_24c);
                        tcu::TestNode::addChild
                                  ((TestNode *)_dynamicAttributeCount,(TestNode *)this_01);
                        std::__cxx11::string::~string((string *)&local_290);
                        std::__cxx11::string::~string((string *)&local_270);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    iVar5 = indexBufferNdx + 1;
    indexBufferNdx = iVar5;
  }
  return iVar5;
}

Assistant:

void DrawCallBatchingTests::init (void)
{
	int drawCallCounts[] = {
		10, 100
	};

	int triangleCounts[] = {
		2, 10
	};

	int staticAttributeCounts[] = {
		1, 0, 4, 8, 0
	};

	int dynamicAttributeCounts[] = {
		0, 1, 4, 0, 8
	};

	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(staticAttributeCounts) == DE_LENGTH_OF_ARRAY(dynamicAttributeCounts));

	for (int drawType = 0; drawType < 2; drawType++)
	{
		bool drawElements = (drawType == 1);

		for (int indexBufferNdx = 0; indexBufferNdx < 2; indexBufferNdx++)
		{
			bool useIndexBuffer = (indexBufferNdx == 1);

			if (useIndexBuffer && !drawElements)
				continue;

			for (int dynamicIndexNdx = 0; dynamicIndexNdx < 2; dynamicIndexNdx++)
			{
				bool dynamicIndices = (dynamicIndexNdx == 1);

				if (dynamicIndices && !drawElements)
					continue;

				if (dynamicIndices && !useIndexBuffer)
					continue;

				TestCaseGroup* drawTypeGroup = new TestCaseGroup(m_context, (string(dynamicIndices ? "dynamic_" : "") + (useIndexBuffer ? "buffer_" : "" ) + (drawElements ? "draw_elements" : "draw_arrays")).c_str(), (string("Test batched rendering with ") + (drawElements ? "draw_elements" : "draw_arrays")).c_str());

				addChild(drawTypeGroup);

				for (int drawCallCountNdx = 0; drawCallCountNdx < DE_LENGTH_OF_ARRAY(drawCallCounts); drawCallCountNdx++)
				{
					int drawCallCount = drawCallCounts[drawCallCountNdx];

					TestCaseGroup*	callCountGroup			= new TestCaseGroup(m_context, (de::toString(drawCallCount) + (drawCallCount == 1 ? "_draw" : "_draws")).c_str(), ("Test batched rendering performance with " + de::toString(drawCallCount) + " draw calls.").c_str());
					TestCaseGroup*	attributeCount1Group	= new TestCaseGroup(m_context, "1_attribute", "Test draw call batching with 1 attribute.");
					TestCaseGroup*	attributeCount8Group	= new TestCaseGroup(m_context, "8_attributes", "Test draw call batching with 8 attributes.");

					callCountGroup->addChild(attributeCount1Group);
					callCountGroup->addChild(attributeCount8Group);

					drawTypeGroup->addChild(callCountGroup);

					for (int attributeCountNdx = 0; attributeCountNdx < DE_LENGTH_OF_ARRAY(dynamicAttributeCounts); attributeCountNdx++)
					{
						TestCaseGroup*	attributeCountGroup		= NULL;

						int				staticAttributeCount	= staticAttributeCounts[attributeCountNdx];
						int				dynamicAttributeCount	= dynamicAttributeCounts[attributeCountNdx];

						if (staticAttributeCount + dynamicAttributeCount == 1)
							attributeCountGroup = attributeCount1Group;
						else if (staticAttributeCount + dynamicAttributeCount == 8)
							attributeCountGroup = attributeCount8Group;
						else
							DE_ASSERT(false);

						for (int triangleCountNdx = 0; triangleCountNdx < DE_LENGTH_OF_ARRAY(triangleCounts); triangleCountNdx++)
						{
							int triangleCount = triangleCounts[triangleCountNdx];

							for (int dynamicBufferNdx = 0; dynamicBufferNdx < 2; dynamicBufferNdx++)
							{
								bool useDynamicBuffer = (dynamicBufferNdx != 0);

								for (int staticBufferNdx = 0; staticBufferNdx < 2; staticBufferNdx++)
								{
									bool useStaticBuffer = (staticBufferNdx != 0);

									DrawCallBatchingTest::TestSpec spec;

									spec.useStaticBuffer		= useStaticBuffer;
									spec.staticAttributeCount	= staticAttributeCount;

									spec.useDynamicBuffer		= useDynamicBuffer;
									spec.dynamicAttributeCount	= dynamicAttributeCount;

									spec.drawCallCount			= drawCallCount;
									spec.triangleCount			= triangleCount;

									spec.useDrawElements		= drawElements;
									spec.useIndexBuffer			= useIndexBuffer;
									spec.dynamicIndices			= dynamicIndices;

									if (spec.useStaticBuffer && spec.staticAttributeCount == 0)
										continue;

									if (spec.useDynamicBuffer && spec.dynamicAttributeCount == 0)
										continue;

									attributeCountGroup->addChild(new DrawCallBatchingTest(m_context, specToName(spec).c_str(), specToDescrpition(spec).c_str(), spec));
								}
							}
						}
					}
				}
			}
		}
	}
}